

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidget::render(QWidget *this,QPainter *painter,QPoint *targetOffset,QRegion *sourceRegion,
               RenderFlags renderFlags)

{
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  pointer pQVar6;
  QWidgetPrivate *pQVar7;
  long *plVar8;
  QWidgetPrivate *in_RCX;
  QPoint *in_RDX;
  QPaintDevice *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QRegion *region;
  LayoutDirection oldLayoutDirection;
  QPainter *oldPainter;
  QPaintDevice *target;
  QPaintEnginePrivate *enginePriv;
  QPaintEngine *engine;
  RenderFlags in_stack_0000005c;
  bool inRenderWithPainter;
  QWidgetPrivate *d;
  qreal opacity;
  QRegion painterClip;
  QRegion oldSystemViewport;
  QRegion oldBaseClip;
  QRegion oldSystemClip;
  QRegion toBePainted;
  QTransform oldTransform;
  QRegion *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  QPainter *in_stack_fffffffffffffe98;
  QWidgetPrivate *in_stack_fffffffffffffea0;
  bool local_151;
  LayoutDirection LVar9;
  QPaintDevice *target_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QRegion in_stack_ffffffffffffff20;
  QRegion in_stack_ffffffffffffff28;
  QRegion local_d0;
  QRegion in_stack_ffffffffffffff38;
  QFlagsStorage<QWidget::RenderFlag> renderFlags_00;
  QRegion local_c0;
  QRegion local_b8 [2];
  QRegion local_a8;
  char local_a0 [32];
  char local_80 [28];
  QFlagsStorage<QWidget::RenderFlag> in_stack_ffffffffffffff9c;
  undefined1 local_58 [80];
  long local_8;
  
  renderFlags_00.i = (Int)((ulong)in_stack_ffffffffffffff38.d >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QPaintDevice *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94,(char *)in_stack_fffffffffffffe88);
    QMessageLogger::warning(local_80,"QWidget::render: Null pointer to painter");
  }
  else {
    bVar1 = QPainter::isActive();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      region = (QRegion *)QPainter::opacity();
      bVar2 = qFuzzyIsNull((double)in_stack_fffffffffffffe88);
      if (!bVar2) {
        d_func((QWidget *)0x36def1);
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36df04);
        local_151 = false;
        if (bVar2) {
          pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                             ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36df21);
          local_151 = (*(ushort *)&pQVar6->field_0x7c >> 6 & 1) != 0;
        }
        local_a8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        if (local_151 == false) {
          QWidgetPrivate::prepareToRender(in_RCX,region,(RenderFlags)renderFlags_00.i);
        }
        else {
          QRegion::QRegion(&local_a8,(QRegion *)in_RCX);
        }
        uVar5 = QRegion::isEmpty();
        if ((uVar5 & 1) == 0) {
          bVar2 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36dfc8);
          if (!bVar2) {
            QWidgetPrivate::createExtra
                      ((QWidgetPrivate *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          }
          pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                             ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36dfe4);
          *(ushort *)&pQVar6->field_0x7c = *(ushort *)&pQVar6->field_0x7c & 0xffbf | 0x40;
          QPainter::paintEngine();
          pQVar7 = (QWidgetPrivate *)QPaintEngine::d_func((QPaintEngine *)0x36e010);
          plVar8 = (long *)QPaintEngine::paintDevice();
          if ((local_151 != false) ||
             ((1.0 <= (double)region && (iVar4 = (**(code **)(*plVar8 + 0x10))(), iVar4 != 4)))) {
            QWidgetPrivate::sharedPainter(in_stack_fffffffffffffea0);
            QWidgetPrivate::setSharedPainter(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
            memcpy(local_58,&DAT_00aa1690,0x50);
            memcpy(local_58,&pQVar7->field_0x40,0x50);
            local_b8[0].d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(local_b8,(QRegion *)&pQVar7->field_0x20);
            local_c0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&local_c0,(QRegion *)&pQVar7->field_0x18);
            QRegion::QRegion((QRegion *)&stack0xffffffffffffff38,(QRegion *)&pQVar7->field_0x38);
            QPainter::layoutDirection();
            uVar5 = QPainter::hasClipping();
            if ((uVar5 & 1) == 0) {
              QPaintEnginePrivate::setSystemViewport
                        ((QPaintEnginePrivate *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         in_stack_fffffffffffffe88);
            }
            else {
              local_d0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              in_stack_fffffffffffffe98 = (QPainter *)QPainter::deviceTransform();
              QPainter::clipRegion();
              QTransform::map((QRegion *)&local_d0);
              QRegion::~QRegion((QRegion *)&stack0xffffffffffffff28);
              in_stack_fffffffffffffea0 = pQVar7;
              uVar5 = QRegion::isEmpty();
              if ((uVar5 & 1) == 0) {
                QRegion::operator&((QRegion *)&stack0xffffffffffffff20,(QRegion *)local_b8);
              }
              else {
                QRegion::QRegion((QRegion *)&stack0xffffffffffffff20,(QRegion *)&local_d0);
              }
              QPaintEnginePrivate::setSystemViewport
                        ((QPaintEnginePrivate *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         in_stack_fffffffffffffe88);
              QRegion::~QRegion((QRegion *)&stack0xffffffffffffff20);
              QRegion::~QRegion(&local_d0);
            }
            target_00 = in_RSI;
            layoutDirection((QWidget *)0x36e2b9);
            QPainter::setLayoutDirection((LayoutDirection)in_RSI);
            QWidgetPrivate::render
                      (in_RDI,target_00,in_RDX,(QRegion *)in_RCX,
                       (RenderFlags)in_stack_ffffffffffffff9c.i);
            LVar9 = (LayoutDirection)target_00;
            QRegion::operator=((QRegion *)&pQVar7->field_0x18,(QRegion *)&local_c0);
            QPaintEnginePrivate::setSystemTransformAndViewport
                      ((QPaintEnginePrivate *)in_stack_fffffffffffffea0,
                       (QTransform *)in_stack_fffffffffffffe98,
                       (QRegion *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
            (**(code **)(*(long *)pQVar7 + 0x10))();
            QPainter::setLayoutDirection(LVar9);
            QWidgetPrivate::setSharedPainter(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
            uVar3 = (ushort)local_151;
            pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                               ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36e36c);
            *(ushort *)&pQVar6->field_0x7c =
                 *(ushort *)&pQVar6->field_0x7c & 0xffbf | (uVar3 & 1) << 6;
            QRegion::~QRegion((QRegion *)&stack0xffffffffffffff38);
            QRegion::~QRegion(&local_c0);
            QRegion::~QRegion(local_b8);
          }
          else {
            QWidgetPrivate::render_helper
                      ((QWidgetPrivate *)in_stack_ffffffffffffff28.d,
                       (QPainter *)in_stack_ffffffffffffff20.d,
                       (QPoint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (QRegion *)in_RDI,in_stack_0000005c);
            pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                               ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36e09f);
            *(ushort *)&pQVar6->field_0x7c = *(ushort *)&pQVar6->field_0x7c & 0xffbf;
          }
        }
        QRegion::~QRegion(&local_a8);
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffe94,(char *)in_stack_fffffffffffffe88);
      QMessageLogger::warning(local_a0,"QWidget::render: Cannot render with an inactive painter");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::render(QPainter *painter, const QPoint &targetOffset,
                     const QRegion &sourceRegion, RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!painter)) {
        qWarning("QWidget::render: Null pointer to painter");
        return;
    }

    if (Q_UNLIKELY(!painter->isActive())) {
        qWarning("QWidget::render: Cannot render with an inactive painter");
        return;
    }

    const qreal opacity = painter->opacity();
    if (qFuzzyIsNull(opacity))
        return; // Fully transparent.

    Q_D(QWidget);
    const bool inRenderWithPainter = d->extra && d->extra->inRenderWithPainter;
    const QRegion toBePainted = !inRenderWithPainter ? d->prepareToRender(sourceRegion, renderFlags)
                                                     : sourceRegion;
    if (toBePainted.isEmpty())
        return;

    if (!d->extra)
        d->createExtra();
    d->extra->inRenderWithPainter = true;

    QPaintEngine *engine = painter->paintEngine();
    Q_ASSERT(engine);
    QPaintEnginePrivate *enginePriv = engine->d_func();
    Q_ASSERT(enginePriv);
    QPaintDevice *target = engine->paintDevice();
    Q_ASSERT(target);

    // Render via a pixmap when dealing with non-opaque painters or printers.
    if (!inRenderWithPainter && (opacity < 1.0 || (target->devType() == QInternal::Printer))) {
        d->render_helper(painter, targetOffset, toBePainted, renderFlags);
        d->extra->inRenderWithPainter = inRenderWithPainter;
        return;
    }

    // Set new shared painter.
    QPainter *oldPainter = d->sharedPainter();
    d->setSharedPainter(painter);

    // Save current system clip, viewport and transform,
    const QTransform oldTransform = enginePriv->systemTransform;
    const QRegion oldSystemClip = enginePriv->systemClip;
    const QRegion oldBaseClip = enginePriv->baseSystemClip;
    const QRegion oldSystemViewport = enginePriv->systemViewport;
    const Qt::LayoutDirection oldLayoutDirection = painter->layoutDirection();

    // This ensures that all painting triggered by render() is clipped to the current engine clip.
    if (painter->hasClipping()) {
        const QRegion painterClip = painter->deviceTransform().map(painter->clipRegion());
        enginePriv->setSystemViewport(oldSystemClip.isEmpty() ? painterClip : oldSystemClip & painterClip);
    } else {
        enginePriv->setSystemViewport(oldSystemClip);
    }
    painter->setLayoutDirection(layoutDirection());

    d->render(target, targetOffset, toBePainted, renderFlags);

    // Restore system clip, viewport and transform.
    enginePriv->baseSystemClip = oldBaseClip;
    enginePriv->setSystemTransformAndViewport(oldTransform, oldSystemViewport);
    enginePriv->systemStateChanged();
    painter->setLayoutDirection(oldLayoutDirection);

    // Restore shared painter.
    d->setSharedPainter(oldPainter);

    d->extra->inRenderWithPainter = inRenderWithPainter;
}